

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditersol.c
# Opt level: O1

int main(int argc,char **argv)

{
  FILE *fp;
  int *piVar1;
  void *pvVar2;
  ulong uVar3;
  double *x;
  double *x_00;
  double *x_01;
  int *etree;
  double *R;
  double *pdVar4;
  double *sol;
  long lVar5;
  int iVar6;
  double dVar7;
  doublereal dVar8;
  doublereal dVar9;
  int n;
  char equed [1];
  int m;
  int iter;
  int_t info;
  int_t nnz;
  int *local_398;
  double local_390;
  double *local_388;
  int *local_380;
  int *local_378;
  int_t *xa;
  int_t *asub;
  double *a;
  mem_usage_t mem_usage;
  double rcond;
  double rpg;
  SuperMatrix A;
  int nnz32;
  SuperMatrix B;
  SuperMatrix U;
  SuperMatrix L;
  SuperLUStat_t stat;
  SuperMatrix X;
  superlu_options_t options;
  char msg [256];
  GlobalLU_t Glu;
  
  fp = _stdin;
  equed[0] = 'B';
  ilu_set_default_options(&options);
  options.PivotGrowth = YES;
  options.ConditionNumber = YES;
  if (argc < 2) {
    printf("Usage:\n%s [OPTION] < [INPUT] > [OUTPUT]\nOPTION:\n-h -hb:\n\t[INPUT] is a Harwell-Boeing format matrix.\n-r -rb:\n\t[INPUT] is a Rutherford-Boeing format matrix.\n-t -triplet:\n\t[INPUT] is a triplet format matrix.\n"
           ,*argv);
  }
  else {
    uVar3 = (ulong)((byte)argv[1][1] - 0x48);
    if ((byte)argv[1][1] - 0x48 < 0x2d) {
      if ((0x100000001U >> (uVar3 & 0x3f) & 1) != 0) {
        puts("Input a Harwell-Boeing format matrix:");
        dreadhb(fp,&m,&n,&nnz,&a,&asub,&xa);
LAB_00101765:
        dCreate_CompCol_Matrix(&A,m,n,nnz,a,asub,xa,SLU_NC,SLU_D,SLU_GE);
        pvVar2 = A.Store;
        dfill_diag(n,(NCformat *)A.Store);
        local_398 = (int *)pvVar2;
        printf("Dimension %dx%d; # nonzeros %d\n",(ulong)(uint)A.nrow,(ulong)(uint)A.ncol,
               (ulong)*pvVar2);
        fflush(_stdout);
        x = doubleMalloc((long)m);
        if (x == (double *)0x0) {
          sprintf(msg,"%s at line %d in file %s\n","Malloc fails for rhsb[].",0xea,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/ditersol.c"
                 );
          superlu_abort_and_exit(msg);
        }
        x_00 = doubleMalloc((long)m);
        if (x_00 == (double *)0x0) {
          sprintf(msg,"%s at line %d in file %s\n","Malloc fails for rhsx[].",0xeb,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/ditersol.c"
                 );
          superlu_abort_and_exit(msg);
        }
        dCreate_Dense_Matrix(&B,m,1,x,m,SLU_DN,SLU_D,SLU_GE);
        dCreate_Dense_Matrix(&X,m,1,x_00,m,SLU_DN,SLU_D,SLU_GE);
        x_01 = doubleMalloc((long)n);
        iVar6 = n;
        dGenXtrue(n,1,x_01,n);
        dFillRHS(NOTRANS,1,x_01,iVar6,&A,&B);
        etree = int32Malloc(n);
        if (etree == (int *)0x0) {
          sprintf(msg,"%s at line %d in file %s\n","Malloc fails for etree[].",0xf3,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/ditersol.c"
                 );
          superlu_abort_and_exit(msg);
        }
        local_378 = int32Malloc(m);
        if (local_378 == (int *)0x0) {
          sprintf(msg,"%s at line %d in file %s\n","Malloc fails for perm_r[].",0xf4,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/ditersol.c"
                 );
          superlu_abort_and_exit(msg);
        }
        local_380 = int32Malloc(n);
        if (local_380 == (int *)0x0) {
          sprintf(msg,"%s at line %d in file %s\n","Malloc fails for perm_c[].",0xf5,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/ditersol.c"
                 );
          superlu_abort_and_exit(msg);
        }
        R = (double *)superlu_malloc((long)A.nrow << 3);
        if (R == (double *)0x0) {
          sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for R[].",0xf7,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/ditersol.c"
                 );
          superlu_abort_and_exit(msg);
        }
        pdVar4 = (double *)superlu_malloc((long)A.ncol << 3);
        if (pdVar4 == (double *)0x0) {
          sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for C[].",0xf9,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/ditersol.c"
                 );
          superlu_abort_and_exit(msg);
        }
        info = 0;
        StatInit(&stat);
        B.ncol = 0;
        local_388 = pdVar4;
        dgsisx(&options,&A,local_380,local_378,etree,equed,R,pdVar4,&L,&U,(void *)0x0,0,&B,&X,&rpg,
               &rcond,&Glu,&mem_usage,&stat,&info);
        pdVar4 = doubleMalloc((long)m);
        if (pdVar4 == (double *)0x0) {
          sprintf(msg,"%s at line %d in file %s\n","Malloc fails for b[].",0x10b,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/ditersol.c"
                 );
          superlu_abort_and_exit(msg);
        }
        if ((equed[0] & 0xefU) == 0x42) {
          if (0 < (long)n) {
            lVar5 = 0;
            do {
              pdVar4[lVar5] = x[lVar5] * R[lVar5];
              lVar5 = lVar5 + 1;
            } while (n != lVar5);
          }
        }
        else if (0 < (long)m) {
          lVar5 = 0;
          do {
            pdVar4[lVar5] = x[lVar5];
            lVar5 = lVar5 + 1;
          } while (m != lVar5);
        }
        printf("dgsisx(): info %lld, equed %c\n",(long)info);
        if (((0 < info) || (rcond < 1e-08)) || (100000000.0 < rpg)) {
          puts("WARNING: This preconditioner might be unstable.");
        }
        if ((info == 0) || (info == n + 1)) {
          if (options.PivotGrowth == YES) {
            printf("Recip. pivot growth = %e\n",rpg);
          }
          if (options.ConditionNumber == YES) {
            printf("Recip. condition number = %e\n",rcond);
          }
        }
        piVar1 = local_398;
        printf("n(A) = %d, nnz(A) = %lld\n",(ulong)(uint)n,(long)*local_398);
        printf("No of nonzeros in factor L = %lld\n",(long)*L.Store);
        printf("No of nonzeros in factor U = %lld\n",(long)*U.Store);
        printf("No of nonzeros in L+U = %lld\n");
        printf("Fill ratio: nnz(F)/nnz(A) = %.1f\n",
               (((double)*U.Store + (double)*L.Store) - (double)n) / (double)*piVar1);
        printf("L\\U MB %.3f\ttotal MB needed %.3f\n",(double)mem_usage.for_lu / 1000000.0,
               (double)mem_usage.total_needed / 1000000.0);
        fflush(_stdout);
        GLOBAL_A = &A;
        GLOBAL_L = &L;
        GLOBAL_U = &U;
        GLOBAL_STAT = &stat;
        GLOBAL_PERM_C = local_380;
        GLOBAL_PERM_R = local_378;
        GLOBAL_OPTIONS = &options;
        GLOBAL_C = local_388;
        GLOBAL_MEM_USAGE = &mem_usage;
        options.Fact = FACTORED;
        options.PivotGrowth = NO;
        options.ConditionNumber = NO;
        iVar6 = 0x32;
        if ((long)n < 0x93) {
          iVar6 = n / 3 + 1;
        }
        iter = 1000;
        GLOBAL_R = R;
        sol = doubleMalloc((long)n);
        if (sol == (double *)0x0) {
          sprintf(msg,"%s at line %d in file %s\n","Malloc fails for x[].",0x142,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/ditersol.c"
                 );
          superlu_abort_and_exit(msg);
        }
        if (info <= n + 1) {
          msg[0] = '\x01';
          msg[1] = '\0';
          msg[2] = '\0';
          msg[3] = '\0';
          if (0 < n) {
            memset(sol,0,(ulong)(uint)n << 3);
          }
          local_390 = SuperLU_timer_();
          dfgmr(n,dmatvec_mult,dpsolve,pdVar4,sol,1e-08,iVar6,&iter,(FILE *)_stdout);
          dVar7 = SuperLU_timer_();
          local_390 = dVar7 - local_390;
          nnz32 = *local_398;
          local_398 = (int *)dnrm2_(&nnz32,*(doublereal **)((long)A.Store + 8),(integer *)msg);
          dVar8 = dnrm2_(&m,pdVar4,(integer *)msg);
          sp_dgemv("N",-1.0,&A,sol,1,1.0,pdVar4,1);
          dVar9 = dnrm2_(&m,pdVar4,(integer *)msg);
          dVar7 = dVar9 / dVar8;
          printf("||A||_F = %.1e, ||B||_2 = %.1e, ||B-A*X||_2 = %.1e, relres = %.1e\n",local_398,
                 dVar8,dVar9);
          if (999 < iter) {
            if (1.0 <= dVar7) {
              iter = -0xb4;
            }
            else if (1e-08 < dVar7) {
              iter = -0x6f;
            }
          }
          printf("iteration: %d\nresidual: %.1e\nGMRES time: %.2f seconds.\n",dVar7,local_390,
                 (ulong)(uint)iter);
          if (((equed[0] & 0xfeU) == 0x42) && (0 < (long)n)) {
            lVar5 = 0;
            do {
              sol[lVar5] = local_388[lVar5] * sol[lVar5];
              lVar5 = lVar5 + 1;
            } while (n != lVar5);
          }
          dVar7 = 0.0;
          if (0 < (long)m) {
            lVar5 = 0;
            do {
              if (dVar7 <= ABS(sol[lVar5] - x_01[lVar5])) {
                dVar7 = ABS(sol[lVar5] - x_01[lVar5]);
              }
              lVar5 = lVar5 + 1;
            } while (m != lVar5);
          }
          printf("||X-X_true||_oo = %.1e\n");
        }
        fflush(_stdout);
        if (options.PrintStat != NO) {
          StatPrint(&stat);
        }
        StatFree(&stat);
        superlu_free(x);
        superlu_free(x_00);
        superlu_free(x_01);
        superlu_free(etree);
        superlu_free(local_378);
        superlu_free(local_380);
        superlu_free(R);
        superlu_free(local_388);
        Destroy_CompCol_Matrix(&A);
        Destroy_SuperMatrix_Store(&B);
        Destroy_SuperMatrix_Store(&X);
        Destroy_SuperNode_Matrix(&L);
        Destroy_CompCol_Matrix(&U);
        superlu_free(pdVar4);
        superlu_free(sol);
        return 0;
      }
      if ((0x40000000400U >> (uVar3 & 0x3f) & 1) != 0) {
        puts("Input a Rutherford-Boeing format matrix:");
        dreadrb(&m,&n,&nnz,&a,&asub,&xa);
        goto LAB_00101765;
      }
      if ((0x100000001000U >> (uVar3 & 0x3f) & 1) != 0) {
        puts("Input a triplet format matrix:");
        dreadtriple(&m,&n,&nnz,&a,&asub,&xa);
        goto LAB_00101765;
      }
    }
    puts("Unrecognized format.");
  }
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
    void dmatvec_mult(double alpha, double x[], double beta, double y[]);
    void dpsolve(int n, double x[], double y[]);
    extern int dfgmr( int n,
	void (*matvec_mult)(double, double [], double, double []),
	void (*psolve)(int n, double [], double[]),
	double *rhs, double *sol, double tol, int restrt, int *itmax,
	FILE *fits);
    extern int dfill_diag(int n, NCformat *Astore);

    char     equed[1] = {'B'};
    trans_t  trans;
    SuperMatrix A, L, U;
    SuperMatrix B, X;
    NCformat *Astore;
    NCformat *Ustore;
    SCformat *Lstore;
    GlobalLU_t	   Glu; /* facilitate multiple factorizations with 
                           SamePattern_SameRowPerm                  */
    double   *a;
    int_t    *asub, *xa;
    int      *etree;
    int      *perm_c; /* column permutation vector */
    int      *perm_r; /* row permutations from partial pivoting */
    int      nrhs, ldx, m, n;
    int_t    info, nnz, lwork;
    double   *rhsb, *rhsx, *xact;
    double   *work = NULL;
    double   *R, *C;
    double   rpg, rcond;
    double zero = 0.0;
    mem_usage_t   mem_usage;
    superlu_options_t options;
    SuperLUStat_t stat;
    FILE 	  *fp = stdin;

    double *x, *b;

#ifdef DEBUG
    extern int num_drop_L, num_drop_U;
#endif

#if ( DEBUGlevel>=1 )
    CHECK_MALLOC("Enter main()");
#endif

    /* Defaults */
    lwork = 0;
    nrhs  = 1;
    trans = NOTRANS;

    /* Set the default input options:
	options.Fact = DOFACT;
	options.Equil = YES;
	options.ColPerm = COLAMD;
	options.DiagPivotThresh = 0.1; //different from complete LU
	options.Trans = NOTRANS;
	options.IterRefine = NOREFINE;
	options.SymmetricMode = NO;
	options.PivotGrowth = NO;
	options.ConditionNumber = NO;
	options.PrintStat = YES;
	options.RowPerm = LargeDiag_MC64;
	options.ILU_DropTol = 1e-4;
	options.ILU_FillTol = 1e-2;
	options.ILU_FillFactor = 10.0;
	options.ILU_DropRule = DROP_BASIC | DROP_AREA;
	options.ILU_Norm = INF_NORM;
	options.ILU_MILU = SILU;
     */
    ilu_set_default_options(&options);

    /* Modify the defaults. */
    options.PivotGrowth = YES;	  /* Compute reciprocal pivot growth */
    options.ConditionNumber = YES;/* Compute reciprocal condition number */

    if ( lwork > 0 ) {
	work = SUPERLU_MALLOC(lwork);
	if ( !work ) ABORT("Malloc fails for work[].");
    }

    /* Read matrix A from a file in Harwell-Boeing format.*/
    if (argc < 2)
    {
	printf("Usage:\n%s [OPTION] < [INPUT] > [OUTPUT]\nOPTION:\n"
		"-h -hb:\n\t[INPUT] is a Harwell-Boeing format matrix.\n"
		"-r -rb:\n\t[INPUT] is a Rutherford-Boeing format matrix.\n"
		"-t -triplet:\n\t[INPUT] is a triplet format matrix.\n",
		argv[0]);
        return EXIT_FAILURE;
    }
    else
    {
	switch (argv[1][1])
	{
	    case 'H':
	    case 'h':
		printf("Input a Harwell-Boeing format matrix:\n");
		dreadhb(fp, &m, &n, &nnz, &a, &asub, &xa);
		break;
	    case 'R':
	    case 'r':
		printf("Input a Rutherford-Boeing format matrix:\n");
		dreadrb(&m, &n, &nnz, &a, &asub, &xa);
		break;
	    case 'T':
	    case 't':
		printf("Input a triplet format matrix:\n");
		dreadtriple(&m, &n, &nnz, &a, &asub, &xa);
		break;
	    default:
		printf("Unrecognized format.\n");
		return EXIT_FAILURE;
	}
    }

    dCreate_CompCol_Matrix(&A, m, n, nnz, a, asub, xa,
                                SLU_NC, SLU_D, SLU_GE);
    Astore = A.Store;
    dfill_diag(n, Astore);
    printf("Dimension %dx%d; # nonzeros %d\n", (int)A.nrow, (int)A.ncol, (int)Astore->nnz);
    fflush(stdout);

    /* Generate the right-hand side */
    if ( !(rhsb = doubleMalloc(m * nrhs)) ) ABORT("Malloc fails for rhsb[].");
    if ( !(rhsx = doubleMalloc(m * nrhs)) ) ABORT("Malloc fails for rhsx[].");
    dCreate_Dense_Matrix(&B, m, nrhs, rhsb, m, SLU_DN, SLU_D, SLU_GE);
    dCreate_Dense_Matrix(&X, m, nrhs, rhsx, m, SLU_DN, SLU_D, SLU_GE);
    xact = doubleMalloc(n * nrhs);
    ldx = n;
    dGenXtrue(n, nrhs, xact, ldx);
    dFillRHS(trans, nrhs, xact, ldx, &A, &B);

    if ( !(etree = int32Malloc(n)) ) ABORT("Malloc fails for etree[].");
    if ( !(perm_r = int32Malloc(m)) ) ABORT("Malloc fails for perm_r[].");
    if ( !(perm_c = int32Malloc(n)) ) ABORT("Malloc fails for perm_c[].");
    if ( !(R = (double *) SUPERLU_MALLOC(A.nrow * sizeof(double))) )
	ABORT("SUPERLU_MALLOC fails for R[].");
    if ( !(C = (double *) SUPERLU_MALLOC(A.ncol * sizeof(double))) )
	ABORT("SUPERLU_MALLOC fails for C[].");

    info = 0;
#ifdef DEBUG
    num_drop_L = 0;
    num_drop_U = 0;
#endif

    /* Initialize the statistics variables. */
    StatInit(&stat);

    /* Compute the incomplete factorization and compute the condition number
       and pivot growth using dgsisx. */
    B.ncol = 0;  /* not to perform triangular solution */
    dgsisx(&options, &A, perm_c, perm_r, etree, equed, R, C, &L, &U, work,
	   lwork, &B, &X, &rpg, &rcond, &Glu, &mem_usage, &stat, &info);

    /* Set RHS for GMRES. */
    if (!(b = doubleMalloc(m))) ABORT("Malloc fails for b[].");
    if (*equed == 'R' || *equed == 'B') {
	for (int i = 0; i < n; ++i) b[i] = rhsb[i] * R[i];
    } else {
	for (int i = 0; i < m; i++) b[i] = rhsb[i];
    }

    printf("dgsisx(): info %lld, equed %c\n", (long long)info, equed[0]);
    if (info > 0 || rcond < 1e-8 || rpg > 1e8)
	printf("WARNING: This preconditioner might be unstable.\n");

    if ( info == 0 || info == n+1 ) {
	if ( options.PivotGrowth == YES )
	    printf("Recip. pivot growth = %e\n", rpg);
	if ( options.ConditionNumber == YES )
	    printf("Recip. condition number = %e\n", rcond);
    } else if ( info > 0 && lwork == -1 ) {
	printf("** Estimated memory: %lld bytes\n", (long long)info - n);
    }

    Lstore = (SCformat *) L.Store;
    Ustore = (NCformat *) U.Store;
    printf("n(A) = %d, nnz(A) = %lld\n", n, (long long) Astore->nnz);
    printf("No of nonzeros in factor L = %lld\n", (long long) Lstore->nnz);
    printf("No of nonzeros in factor U = %lld\n", (long long) Ustore->nnz);
    printf("No of nonzeros in L+U = %lld\n", (long long) Lstore->nnz + Ustore->nnz - n);
    printf("Fill ratio: nnz(F)/nnz(A) = %.1f\n",
	    ((double)(Lstore->nnz) + (double)(Ustore->nnz) - (double)n)
	    / (double)Astore->nnz);
    printf("L\\U MB %.3f\ttotal MB needed %.3f\n",
	   mem_usage.for_lu/1e6, mem_usage.total_needed/1e6);
    fflush(stdout);

    /* Set the global variables. */
    GLOBAL_A = &A;
    GLOBAL_L = &L;
    GLOBAL_U = &U;
    GLOBAL_STAT = &stat;
    GLOBAL_PERM_C = perm_c;
    GLOBAL_PERM_R = perm_r;
    GLOBAL_OPTIONS = &options;
    GLOBAL_R = R;
    GLOBAL_C = C;
    GLOBAL_MEM_USAGE = &mem_usage;

    /* Set the options to do solve-only. */
    options.Fact = FACTORED;
    options.PivotGrowth = NO;
    options.ConditionNumber = NO;

    /* Set the variables used by GMRES. */
    int restrt = SUPERLU_MIN(n / 3 + 1, 50);
    int maxit = 1000;
    int iter = maxit;
    double resid = 1e-8;
    if (!(x = doubleMalloc(n))) ABORT("Malloc fails for x[].");

    if (info <= n + 1)
    {
	int i_1 = 1, nnz32;
	double maxferr = 0.0, nrmA, nrmB, res, t;
	extern double dnrm2_(int *, double [], int *);
	extern void daxpy_(int *, double *, double [], int *, double [], int *);

	/* Initial guess */
	for (int i = 0; i < n; i++) x[i] = zero;

	t = SuperLU_timer_();

	/* Call GMRES */
	dfgmr(n, dmatvec_mult, dpsolve, b, x, resid, restrt, &iter, stdout);

	t = SuperLU_timer_() - t;

	/* Output the result. */
	nnz32 = Astore->nnz;
	nrmA = dnrm2_(&nnz32, (double *)((NCformat *)A.Store)->nzval,
		&i_1);
	nrmB = dnrm2_(&m, b, &i_1);
	sp_dgemv("N", -1.0, &A, x, 1, 1.0, b, 1);
	res = dnrm2_(&m, b, &i_1);
	resid = res / nrmB;
	printf("||A||_F = %.1e, ||B||_2 = %.1e, ||B-A*X||_2 = %.1e, "
		"relres = %.1e\n", nrmA, nrmB, res, resid);

	if (iter >= maxit)
	{
	    if (resid >= 1.0) iter = -180;
	    else if (resid > 1e-8) iter = -111;
	}
	printf("iteration: %d\nresidual: %.1e\nGMRES time: %.2f seconds.\n",
		iter, resid, t);

	/* Scale the solution back if equilibration was performed. */
	if (*equed == 'C' || *equed == 'B') 
	    for (int i = 0; i < n; i++) x[i] *= C[i];

	for (int i = 0; i < m; i++) {
	    maxferr = SUPERLU_MAX(maxferr, fabs(x[i] - xact[i]));
        }
	printf("||X-X_true||_oo = %.1e\n", maxferr);
    }
#ifdef DEBUG
    printf("%d entries in L and %d entries in U dropped.\n",
	    num_drop_L, num_drop_U);
#endif
    fflush(stdout);

    if ( options.PrintStat ) StatPrint(&stat);
    StatFree(&stat);

    SUPERLU_FREE (rhsb);
    SUPERLU_FREE (rhsx);
    SUPERLU_FREE (xact);
    SUPERLU_FREE (etree);
    SUPERLU_FREE (perm_r);
    SUPERLU_FREE (perm_c);
    SUPERLU_FREE (R);
    SUPERLU_FREE (C);
    Destroy_CompCol_Matrix(&A);
    Destroy_SuperMatrix_Store(&B);
    Destroy_SuperMatrix_Store(&X);
    if ( lwork >= 0 ) {
	Destroy_SuperNode_Matrix(&L);
	Destroy_CompCol_Matrix(&U);
    }
    SUPERLU_FREE(b);
    SUPERLU_FREE(x);

#if ( DEBUGlevel>=1 )
    CHECK_MALLOC("Exit main()");
#endif

    return EXIT_SUCCESS;
}